

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_http.c
# Opt level: O1

int mk_http_error(int http_status,mk_http_session *cs,mk_http_request *sr,mk_server *server)

{
  mk_ptr_t *p;
  mk_iov *pmVar1;
  iovec *piVar2;
  mk_list *pmVar3;
  mk_iov *pmVar4;
  mk_stream_input *pmVar5;
  int iVar6;
  unsigned_long uVar7;
  char *pcVar8;
  mk_list *pmVar9;
  mk_ptr_t page;
  mk_ptr_t message;
  size_t count;
  file_info finfo;
  char *local_78;
  unsigned_long uStack_70;
  mk_ptr_t local_68;
  size_t local_50;
  file_info local_48;
  
  if (server->workers == 0) {
    return 0;
  }
  mk_header_set_http_status(sr,http_status);
  local_78 = (char *)0x0;
  uStack_70 = 0;
  if ((0xd < http_status - 400U) || ((0x2801U >> (http_status - 400U & 0x1f) & 1) == 0)) {
    for (pmVar9 = (sr->host_conf->error_pages).next; pmVar9 != &sr->host_conf->error_pages;
        pmVar9 = pmVar9->next) {
      if (*(short *)&pmVar9[-2].next == http_status) {
        iVar6 = mk_file_get_info((char *)pmVar9[-1].next,&local_48,2);
        if ((iVar6 != -1) && (iVar6 = open((char *)pmVar9[-1].next,server->open_flags), iVar6 != -1)
           ) {
          (sr->headers).content_length = local_48.size;
          (sr->headers).real_length = local_48.size;
          mk_header_prepare(cs,sr,server);
          iVar6 = sr->file_fd;
          (sr->in_file).dynamic = 0;
          (sr->in_file).fd = iVar6;
          (sr->in_file).type = 2;
          (sr->in_file).bytes_offset = 0;
          (sr->in_file).buffer = (void *)0x0;
          (sr->in_file).cb_consumed = (_func_void_mk_stream_input_ptr_long *)0x0;
          (sr->in_file).cb_finished = (_func_void_mk_stream_input_ptr *)0x0;
          (sr->in_file).stream = &sr->stream;
          (sr->in_file).bytes_total = local_48.size;
          pmVar9 = &(sr->in_file)._head;
          pmVar3 = (sr->stream).inputs.prev;
          (sr->stream).inputs.prev = pmVar9;
          (sr->in_file)._head.next = &(sr->stream).inputs;
          (sr->in_file)._head.prev = pmVar3;
          pmVar3->next = pmVar9;
          return 0;
        }
        break;
      }
    }
  }
  local_68.data = (char *)0x0;
  local_68.len = 0;
  if (http_status < 0x19d) {
    if (http_status == 0x193) {
      pcVar8 = "Forbidden";
    }
    else {
      if (http_status == 0x194) {
        mk_string_build(&local_68.data,&local_68.len,
                        "The requested URL was not found on this server.");
        pcVar8 = "Not Found";
        goto LAB_0010bc25;
      }
      if (http_status != 0x195) goto LAB_0010bc5c;
      pcVar8 = "Method Not Allowed";
    }
  }
  else {
    if (http_status == 0x19d) {
      mk_string_build(&local_68.data,&local_68.len,"The request entity is too large.");
      pcVar8 = "Entity too large";
LAB_0010bc25:
      mk_http_error_page(pcVar8,&local_68,server->server_signature,&local_78,&uStack_70);
      mk_ptr_free(&local_68);
      goto LAB_0010bc5c;
    }
    if (http_status == 500) {
      pcVar8 = "Internal Server Error";
    }
    else {
      if (http_status != 0x1f5) goto LAB_0010bc5c;
      pcVar8 = "Method Not Implemented";
    }
  }
  mk_http_error_page(pcVar8,&sr->uri,server->server_signature,&local_78,&uStack_70);
LAB_0010bc5c:
  if (((uStack_70 == 0) || (sr->method == 7)) || (uVar7 = uStack_70, sr->method == 2)) {
    uVar7 = 0;
  }
  (sr->headers).content_length = uVar7;
  (sr->headers).location = (char *)0x0;
  (sr->headers).cgi = 0;
  (sr->headers).pconnections_left = 0;
  (sr->headers).last_modified = -1;
  p = &(sr->headers).content_type;
  if (local_78 == (char *)0x0) {
    p->data = (char *)0x0;
    (sr->headers).content_type.len = 0;
  }
  else {
    mk_ptr_set(p,"Content-Type: text/html\r\n");
  }
  mk_header_prepare(cs,sr,server);
  if (local_78 != (char *)0x0) {
    if (sr->method == 2) {
      free(local_78);
    }
    else {
      pmVar1 = (sr->headers)._extra_rows;
      pmVar4 = &(sr->headers).headers_iov;
      pmVar5 = &sr->in_headers;
      if (pmVar1 != (mk_iov *)0x0) {
        pmVar4 = pmVar1;
        pmVar5 = &sr->in_headers_extra;
      }
      pmVar5->bytes_total = pmVar5->bytes_total + uStack_70;
      piVar2 = pmVar4->io;
      iVar6 = pmVar4->iov_idx;
      piVar2[iVar6].iov_base = local_78;
      piVar2[iVar6].iov_len = (long)(int)uStack_70;
      pmVar4->iov_idx = iVar6 + 1;
      pmVar4->total_len = pmVar4->total_len + (long)(int)uStack_70;
      iVar6 = pmVar4->buf_idx;
      pmVar4->buf_to_free[iVar6] = local_78;
      pmVar4->buf_idx = iVar6 + 1;
    }
  }
  mk_channel_write(cs->channel,&local_50);
  mk_http_request_end(cs,server);
  return 0;
}

Assistant:

int mk_http_error(int http_status, struct mk_http_session *cs,
                  struct mk_http_request *sr,
                  struct mk_server *server)
{
    int ret, fd;
    size_t count;
    mk_ptr_t message;
    mk_ptr_t page;
    struct mk_vhost_error_page *entry;
    struct mk_list *head;
    struct file_info finfo;
    struct mk_iov *iov;

    /* This function requires monkey to be properly initialized which is not the case
     * when it's just used to parse http requests in fluent-bit so we want it to ignore
     * that case and let fluent-bit handle it.
    */
    if (server->workers == 0) {
        return MK_EXIT_OK;
    }

    mk_header_set_http_status(sr, http_status);
    mk_ptr_reset(&page);

    /*
     * We are nice sending error pages for clients who at least respect
     * the especification
     */
    if (http_status != MK_CLIENT_LENGTH_REQUIRED &&
        http_status != MK_CLIENT_BAD_REQUEST &&
        http_status != MK_CLIENT_REQUEST_ENTITY_TOO_LARGE) {

        /* Lookup a customized error page */
        mk_list_foreach(head, &sr->host_conf->error_pages) {
            entry = mk_list_entry(head, struct mk_vhost_error_page, _head);
            if (entry->status != http_status) {
                continue;
            }

            /* validate error file */
            ret = mk_file_get_info(entry->real_path, &finfo, MK_FILE_READ);
            if (ret == -1) {
                break;
            }

            /* open file */
            fd = open(entry->real_path, server->open_flags);
            if (fd == -1) {
                break;
            }
            /* This fd seems to be leaked, we need to verify this logic */

            /* Outgoing headers */
            sr->headers.content_length = finfo.size;
            sr->headers.real_length    = finfo.size;
            mk_header_prepare(cs, sr, server);

            /* Stream setup */
            mk_stream_in_file(&sr->stream, &sr->in_file, sr->file_fd,
                              finfo.size, 0, NULL, NULL);
            return MK_EXIT_OK;
        }
    }

    mk_ptr_reset(&message);

    switch (http_status) {
    case MK_CLIENT_FORBIDDEN:
        mk_http_error_page("Forbidden",
                           &sr->uri,
                           server->server_signature,
                           &page.data, &page.len);
        break;
    case MK_CLIENT_NOT_FOUND:
        mk_string_build(&message.data, &message.len,
                        "The requested URL was not found on this server.");
        mk_http_error_page("Not Found",
                           &message,
                           server->server_signature,
                           &page.data, &page.len);
        mk_ptr_free(&message);
        break;
    case MK_CLIENT_REQUEST_ENTITY_TOO_LARGE:
        mk_string_build(&message.data, &message.len,
                        "The request entity is too large.");
        mk_http_error_page("Entity too large",
                           &message,
                           server->server_signature,
                           &page.data, &page.len);
        mk_ptr_free(&message);
        break;
    case MK_CLIENT_METHOD_NOT_ALLOWED:
        mk_http_error_page("Method Not Allowed",
                           &sr->uri,
                           server->server_signature,
                           &page.data, &page.len);
        break;
    case MK_SERVER_NOT_IMPLEMENTED:
        mk_http_error_page("Method Not Implemented",
                           &sr->uri,
                           server->server_signature,
                           &page.data, &page.len);
        break;
    case MK_SERVER_INTERNAL_ERROR:
        mk_http_error_page("Internal Server Error",
                           &sr->uri,
                           server->server_signature,
                           &page.data, &page.len);
        break;
    }

    if (page.len > 0 && sr->method != MK_METHOD_HEAD && sr->method != MK_METHOD_UNKNOWN) {
        sr->headers.content_length = page.len;
    }
    else {
        sr->headers.content_length = 0;
    }

    sr->headers.location = NULL;
    sr->headers.cgi = SH_NOCGI;
    sr->headers.pconnections_left = 0;
    sr->headers.last_modified = -1;

    if (!page.data) {
        mk_ptr_reset(&sr->headers.content_type);
    }
    else {
        mk_ptr_set(&sr->headers.content_type, "Content-Type: text/html\r\n");
    }

    mk_header_prepare(cs, sr, server);
    if (page.data) {
        if (sr->method != MK_METHOD_HEAD) {
            if (sr->headers._extra_rows) {
                iov = sr->headers._extra_rows;
                sr->in_headers_extra.bytes_total += page.len;
            }
            else {
                iov = &sr->headers.headers_iov;
                sr->in_headers.bytes_total += page.len;
            }
            mk_iov_add(iov, page.data, page.len, MK_TRUE);
        }
        else {
            mk_mem_free(page.data);
        }
    }

    mk_channel_write(cs->channel, &count);
    mk_http_request_end(cs, server);

    return MK_EXIT_OK;
}